

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

String * Socket::getErrorString(String *__return_storage_ptr__,int error)

{
  char *s;
  usize length;
  char *errorMessage;
  int error_local;
  
  s = strerror(error);
  length = String::length(s);
  String::String(__return_storage_ptr__,s,length);
  return __return_storage_ptr__;
}

Assistant:

String Socket::getErrorString(int error)
{
#ifdef _WIN32
  char errorMessage[256];
  DWORD len = FormatMessage(
        FORMAT_MESSAGE_FROM_SYSTEM |
        FORMAT_MESSAGE_IGNORE_INSERTS,
        NULL,
        error,
        MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
        (LPTSTR) errorMessage,
        256, NULL );
  ASSERT(len >= 0 && len <= 256);
  while(len > 0 && isspace(((unsigned char*)errorMessage)[len - 1]))
    --len;
  errorMessage[len] = '\0';
  return String(errorMessage, len);
#else
  const char* errorMessage = ::strerror(error);
  return String(errorMessage, String::length(errorMessage));
#endif
}